

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  Block local_e0;
  undefined1 local_70 [8];
  Blockchain A;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string s;
  char **argv_local;
  int argc_local;
  
  __s = *argv;
  s.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  Blockchain::Blockchain((Blockchain *)local_70);
  poVar1 = std::operator<<((ostream *)&std::cout,"New block added");
  std::operator<<(poVar1,'\n');
  Block::Block(&local_e0,1,(string *)local_38);
  Blockchain::addBlock((Blockchain *)local_70,&local_e0);
  Block::~Block(&local_e0);
  Blockchain::~Blockchain((Blockchain *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    string s = argv[0];
    Blockchain A = Blockchain();
    std::cout << "New block added"<<'\n';
    A.addBlock(Block(1,s));
    return 0;
}